

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Bool FT_Get_Paint(FT_Face face,FT_OpaquePaint opaque_paint,FT_COLR_Paint *paint)

{
  code *UNRECOVERED_JUMPTABLE;
  FT_Bool FVar1;
  
  if (((paint != (FT_COLR_Paint *)0x0 && face != (FT_Face)0x0) && ((face->face_flags & 8) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&face[3].units_per_EM + 0x130),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    FVar1 = (*UNRECOVERED_JUMPTABLE)(face,opaque_paint.p,opaque_paint.insert_root_transform);
    return FVar1;
  }
  return '\0';
}

Assistant:

FT_EXPORT_DEF( FT_Bool )
  FT_Get_Paint( FT_Face face,
                FT_OpaquePaint  opaque_paint,
                FT_COLR_Paint*  paint )
  {
    TT_Face       ttface;
    SFNT_Service  sfnt;


    if ( !face || !paint )
      return 0;

    if ( !FT_IS_SFNT( face ) )
      return 0;

    ttface = (TT_Face)face;
    sfnt   = (SFNT_Service)ttface->sfnt;

    if ( sfnt->get_paint )
      return sfnt->get_paint( ttface, opaque_paint, paint );
    else
      return 0;
  }